

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::SetUseUtf8StringEscaping(Printer *this,bool as_utf8)

{
  FieldValuePrinter *local_60;
  bool as_utf8_local;
  Printer *this_local;
  
  if (as_utf8) {
    local_60 = (FieldValuePrinter *)operator_new(8);
    ((FieldValuePrinter *)&local_60->_vptr_FieldValuePrinter)->_vptr_FieldValuePrinter =
         (_func_int **)0x0;
    anon_unknown_20::FieldValuePrinterUtf8Escaping::FieldValuePrinterUtf8Escaping
              ((FieldValuePrinterUtf8Escaping *)local_60);
  }
  else {
    local_60 = (FieldValuePrinter *)operator_new(8);
    FieldValuePrinter::FieldValuePrinter(local_60);
  }
  SetDefaultFieldValuePrinter(this,local_60);
  return;
}

Assistant:

void TextFormat::Printer::SetUseUtf8StringEscaping(bool as_utf8) {
  SetDefaultFieldValuePrinter(as_utf8
                              ? new FieldValuePrinterUtf8Escaping()
                              : new FieldValuePrinter());
}